

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommonTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmCommonTargetGenerator::AddFortranFlags(cmCommonTargetGenerator *this,string *flags)

{
  cmMakefile *pcVar1;
  cmGeneratorTarget *target;
  cmLocalCommonGenerator *this_00;
  char *pcVar2;
  char *pcVar3;
  pointer source;
  allocator local_d1;
  string modflag;
  string flg;
  string mod_dir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  string local_50;
  
  pcVar1 = this->Makefile;
  std::__cxx11::string::string((string *)&mod_dir,"CMAKE_Fortran_MODOUT_FLAG",(allocator *)&modflag)
  ;
  pcVar2 = cmMakefile::GetDefinition(pcVar1,&mod_dir);
  std::__cxx11::string::~string((string *)&mod_dir);
  if (pcVar2 != (char *)0x0) {
    (*(this->LocalGenerator->super_cmLocalGenerator)._vptr_cmLocalGenerator[6])
              (this->LocalGenerator,flags,pcVar2);
  }
  GetFortranModuleDirectory_abi_cxx11_(&mod_dir,this);
  if (mod_dir._M_string_length == 0) {
    pcVar1 = this->Makefile;
    std::__cxx11::string::string
              ((string *)&modflag,"CMAKE_Fortran_MODDIR_DEFAULT",(allocator *)&flg);
    cmMakefile::GetSafeDefinition(pcVar1,&modflag);
    std::__cxx11::string::assign((char *)&mod_dir);
  }
  else {
    Convert(&modflag,this,&mod_dir,this->WorkingDirectory,SHELL);
    std::__cxx11::string::operator=((string *)&mod_dir,(string *)&modflag);
  }
  std::__cxx11::string::~string((string *)&modflag);
  if (mod_dir._M_string_length != 0) {
    pcVar1 = this->Makefile;
    std::__cxx11::string::string((string *)&modflag,"CMAKE_Fortran_MODDIR_FLAG",(allocator *)&flg);
    pcVar2 = cmMakefile::GetRequiredDefinition(pcVar1,&modflag);
    std::__cxx11::string::~string((string *)&modflag);
    std::__cxx11::string::string((string *)&modflag,pcVar2,(allocator *)&flg);
    std::__cxx11::string::append((string *)&modflag);
    (*(this->LocalGenerator->super_cmLocalGenerator)._vptr_cmLocalGenerator[5])
              (this->LocalGenerator,flags,&modflag);
    std::__cxx11::string::~string((string *)&modflag);
  }
  pcVar1 = this->Makefile;
  std::__cxx11::string::string((string *)&modflag,"CMAKE_Fortran_MODPATH_FLAG",(allocator *)&flg);
  pcVar2 = cmMakefile::GetDefinition(pcVar1,&modflag);
  std::__cxx11::string::~string((string *)&modflag);
  if (pcVar2 != (char *)0x0) {
    includes.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    includes.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    includes.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pcVar1 = this->Makefile;
    std::__cxx11::string::string((string *)&flg,"CMAKE_BUILD_TYPE",(allocator *)&local_50);
    pcVar3 = cmMakefile::GetSafeDefinition(pcVar1,&flg);
    std::__cxx11::string::string((string *)&modflag,pcVar3,&local_d1);
    std::__cxx11::string::~string((string *)&flg);
    target = this->GeneratorTarget;
    this_00 = this->LocalGenerator;
    std::__cxx11::string::string((string *)&flg,"C",(allocator *)&local_50);
    cmLocalGenerator::GetIncludeDirectories
              (&this_00->super_cmLocalGenerator,&includes,target,&flg,&modflag,true);
    std::__cxx11::string::~string((string *)&flg);
    for (source = includes.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        source != includes.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; source = source + 1) {
      std::__cxx11::string::string((string *)&flg,pcVar2,(allocator *)&local_50);
      Convert(&local_50,this,source,NONE,SHELL);
      std::__cxx11::string::append((string *)&flg);
      std::__cxx11::string::~string((string *)&local_50);
      (*(this->LocalGenerator->super_cmLocalGenerator)._vptr_cmLocalGenerator[5])
                (this->LocalGenerator,flags,&flg);
      std::__cxx11::string::~string((string *)&flg);
    }
    std::__cxx11::string::~string((string *)&modflag);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&includes);
  }
  std::__cxx11::string::~string((string *)&mod_dir);
  return;
}

Assistant:

void cmCommonTargetGenerator::AddFortranFlags(std::string& flags)
{
  // Enable module output if necessary.
  if(const char* modout_flag =
     this->Makefile->GetDefinition("CMAKE_Fortran_MODOUT_FLAG"))
    {
    this->LocalGenerator->AppendFlags(flags, modout_flag);
    }

  // Add a module output directory flag if necessary.
  std::string mod_dir = this->GetFortranModuleDirectory();
  if (!mod_dir.empty())
    {
    mod_dir = this->Convert(mod_dir,
                            this->WorkingDirectory,
                            cmLocalGenerator::SHELL);
    }
  else
    {
    mod_dir =
      this->Makefile->GetSafeDefinition("CMAKE_Fortran_MODDIR_DEFAULT");
    }
  if (!mod_dir.empty())
    {
    const char* moddir_flag =
      this->Makefile->GetRequiredDefinition("CMAKE_Fortran_MODDIR_FLAG");
    std::string modflag = moddir_flag;
    modflag += mod_dir;
    this->LocalGenerator->AppendFlags(flags, modflag);
    }

  // If there is a separate module path flag then duplicate the
  // include path with it.  This compiler does not search the include
  // path for modules.
  if(const char* modpath_flag =
     this->Makefile->GetDefinition("CMAKE_Fortran_MODPATH_FLAG"))
    {
    std::vector<std::string> includes;
    const std::string& config =
      this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE");
    this->LocalGenerator->GetIncludeDirectories(includes,
                                                this->GeneratorTarget,
                                                "C", config);
    for(std::vector<std::string>::const_iterator idi = includes.begin();
        idi != includes.end(); ++idi)
      {
      std::string flg = modpath_flag;
      flg += this->Convert(*idi,
                           cmLocalGenerator::NONE,
                           cmLocalGenerator::SHELL);
      this->LocalGenerator->AppendFlags(flags, flg);
      }
    }
}